

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cpp
# Opt level: O3

void __thiscall NetworkNS::dump::dump(dump *this,string *filename_to_open)

{
  ofstream *this_00;
  
  this->_vptr_dump = (_func_int **)&PTR__dump_0010fd88;
  this_00 = &this->my_file;
  std::ofstream::ofstream(this_00);
  std::ofstream::open((char *)this_00,(_Ios_Openmode)(filename_to_open->_M_dataplus)._M_p);
  if (*(int *)(&this->field_0x28 + *(long *)(*(long *)this_00 + -0x18)) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Specified dump file does not exist!",0x23);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
  }
  return;
}

Assistant:

dump::dump(std::string filename_to_open) {
      
      my_file.open(filename_to_open.c_str(), ofstream::out);
      if (not my_file.good())
         cout << "Specified dump file does not exist!" << endl;

   }